

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbox.cpp
# Opt level: O0

void __thiscall ftxui::DBox::SetBox(DBox *this,Box box)

{
  bool bVar1;
  Elements *this_00;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  shared_ptr<ftxui::Node> *child;
  iterator __end2;
  iterator __begin2;
  Elements *__range2;
  DBox *this_local;
  Box box_local;
  
  Node::SetBox(&this->super_Node,box);
  this_00 = &(this->super_Node).children_;
  __end2 = std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ::begin(this_00);
  child = (shared_ptr<ftxui::Node> *)
          std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
                                *)&child);
    if (!bVar1) break;
    this_01 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
              ::operator*(&__end2);
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    (*peVar2->_vptr_Node[3])(peVar2,box._0_8_,box._8_8_);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    for (auto& child : children_)
      child->SetBox(box);
  }